

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  vfloat<4> vVar2;
  BVH *bvh;
  size_t sVar3;
  Geometry *pGVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [12];
  byte bVar43;
  int iVar44;
  AABBNodeMB4D *node1;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  byte bVar48;
  long lVar49;
  ulong uVar50;
  NodeRef *pNVar51;
  byte bVar52;
  NodeRef root;
  long lVar53;
  ulong uVar54;
  ulong uVar55;
  vuint<4> *v;
  uint uVar56;
  undefined4 uVar57;
  QuadMesh *mesh;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar58;
  bool bVar59;
  byte bVar60;
  ulong uVar61;
  ulong uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  vfloat_impl<4> vVar88;
  vfloat_impl<4> vVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  float fVar99;
  float fVar100;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar101;
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar105 [64];
  vint4 ai_2;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 in_ZMM2 [64];
  vint4 ai;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar115;
  float fVar118;
  float fVar119;
  vint4 ai_1;
  undefined1 auVar116 [16];
  float fVar120;
  undefined1 auVar117 [16];
  float fVar121;
  float fVar127;
  float fVar128;
  vint4 ai_3;
  undefined1 auVar122 [16];
  float fVar129;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar130;
  float fVar134;
  float fVar135;
  vint4 bi;
  float fVar136;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar137;
  float fVar142;
  float fVar143;
  vint4 bi_1;
  float fVar144;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  vint4 bi_3;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [64];
  vint4 bi_2;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [64];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  uint uVar160;
  uint uVar163;
  uint uVar164;
  uint uVar165;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 in_ZMM14 [64];
  undefined1 in_ZMM15 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  uint local_19cc;
  vuint<4> *v_1;
  Precalculations pre;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  int local_1938;
  int iStack_1934;
  int iStack_1930;
  Vec3<embree::vfloat_impl<4>_> p0;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar63 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar68 = ZEXT816(0) << 0x40;
    uVar11 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar68,5);
    uVar61 = vpcmpeqd_avx512vl(auVar63,(undefined1  [16])valid_i->field_0);
    uVar61 = ((byte)uVar11 & 0xf) & uVar61;
    bVar60 = (byte)uVar61;
    if (bVar60 != 0) {
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar168 = ZEXT1664(auVar63);
      auVar64 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar63);
      auVar66._8_4_ = 0x219392ef;
      auVar66._0_8_ = 0x219392ef219392ef;
      auVar66._12_4_ = 0x219392ef;
      auVar154 = ZEXT1664(auVar66);
      uVar45 = vcmpps_avx512vl(auVar64,auVar66,1);
      bVar59 = (bool)((byte)uVar45 & 1);
      auVar64._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * tray.dir.field_0._0_4_;
      bVar59 = (bool)((byte)(uVar45 >> 1) & 1);
      auVar64._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * tray.dir.field_0._4_4_;
      bVar59 = (bool)((byte)(uVar45 >> 2) & 1);
      auVar64._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * tray.dir.field_0._8_4_;
      bVar59 = (bool)((byte)(uVar45 >> 3) & 1);
      auVar64._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * tray.dir.field_0._12_4_;
      auVar65 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar63);
      uVar45 = vcmpps_avx512vl(auVar65,auVar66,1);
      bVar59 = (bool)((byte)uVar45 & 1);
      auVar65._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * tray.dir.field_0._16_4_;
      bVar59 = (bool)((byte)(uVar45 >> 1) & 1);
      auVar65._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * tray.dir.field_0._20_4_;
      bVar59 = (bool)((byte)(uVar45 >> 2) & 1);
      auVar65._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * tray.dir.field_0._24_4_;
      bVar59 = (bool)((byte)(uVar45 >> 3) & 1);
      auVar65._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * tray.dir.field_0._28_4_;
      auVar63 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar63);
      uVar45 = vcmpps_avx512vl(auVar63,auVar66,1);
      bVar59 = (bool)((byte)uVar45 & 1);
      auVar63._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * tray.dir.field_0._32_4_;
      bVar59 = (bool)((byte)(uVar45 >> 1) & 1);
      auVar63._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * tray.dir.field_0._36_4_;
      bVar59 = (bool)((byte)(uVar45 >> 2) & 1);
      auVar63._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * tray.dir.field_0._40_4_;
      bVar59 = (bool)((byte)(uVar45 >> 3) & 1);
      auVar63._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * tray.dir.field_0._44_4_;
      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar169 = ZEXT1664(auVar66);
      auVar67 = vrcp14ps_avx512vl(auVar64);
      auVar64 = vfnmadd213ps_avx512vl(auVar64,auVar67,auVar66);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar64,auVar67,auVar67)
      ;
      auVar64 = vrcp14ps_avx512vl(auVar65);
      auVar65 = vfnmadd213ps_avx512vl(auVar65,auVar64,auVar66);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar65,auVar64,auVar64)
      ;
      auVar64 = vrcp14ps_avx512vl(auVar63);
      auVar149 = ZEXT1664(auVar64);
      auVar63 = vfnmadd213ps_avx512vl(auVar63,auVar64,auVar66);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar63,auVar64,auVar64)
      ;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      tray.org_rdir.field_0._0_4_ = *(float *)ray * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = *(float *)(ray + 4) * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = *(float *)(ray + 8) * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = *(float *)(ray + 0xc) * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      uVar45 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar68,1);
      auVar63 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar45 & 1) * auVar63._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar45 >> 1) & 1) * auVar63._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar45 >> 2) & 1) * auVar63._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar45 >> 3) & 1) * auVar63._12_4_;
      uVar45 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar68,5);
      auVar63 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar59 = (bool)((byte)uVar45 & 1);
      bVar7 = (bool)((byte)(uVar45 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar45 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar45 >> 3) & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar59 * auVar63._0_4_ | (uint)!bVar59 * 0x30;
      tray.nearXYZ.field_0._20_4_ = (uint)bVar7 * auVar63._4_4_ | (uint)!bVar7 * 0x30;
      tray.nearXYZ.field_0._24_4_ = (uint)bVar8 * auVar63._8_4_ | (uint)!bVar8 * 0x30;
      tray.nearXYZ.field_0._28_4_ = (uint)bVar9 * auVar63._12_4_ | (uint)!bVar9 * 0x30;
      uVar45 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar68,5);
      auVar63 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar59 = (bool)((byte)uVar45 & 1);
      bVar7 = (bool)((byte)(uVar45 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar45 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar45 >> 3) & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar59 * auVar63._0_4_ | (uint)!bVar59 * 0x50;
      tray.nearXYZ.field_0._36_4_ = (uint)bVar7 * auVar63._4_4_ | (uint)!bVar7 * 0x50;
      tray.nearXYZ.field_0._40_4_ = (uint)bVar8 * auVar63._8_4_ | (uint)!bVar8 * 0x50;
      tray.nearXYZ.field_0._44_4_ = (uint)bVar9 * auVar63._12_4_ | (uint)!bVar9 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar171 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar63 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar68);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar60 & 1) * auVar63._0_4_ |
           (uint)!(bool)(bVar60 & 1) * stack_near[0].field_0._0_4_;
      bVar59 = (bool)((byte)(uVar61 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar59 * auVar63._4_4_ | (uint)!bVar59 * stack_near[0].field_0._4_4_;
      bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar59 * auVar63._8_4_ | (uint)!bVar59 * stack_near[0].field_0._8_4_;
      bVar59 = SUB81(uVar61 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar59 * auVar63._12_4_ | (uint)!bVar59 * stack_near[0].field_0._12_4_;
      auVar63 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar170 = ZEXT1664(auVar63);
      auVar68 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar68);
      tray.tfar.field_0.i[0] =
           (uint)(bVar60 & 1) * auVar68._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar63._0_4_;
      bVar59 = (bool)((byte)(uVar61 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar59 * auVar68._4_4_ | (uint)!bVar59 * auVar63._4_4_;
      bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar59 * auVar68._8_4_ | (uint)!bVar59 * auVar63._8_4_;
      bVar59 = SUB81(uVar61 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar59 * auVar68._12_4_ | (uint)!bVar59 * auVar63._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar56 = 3;
      }
      else {
        uVar56 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      local_19cc = (ushort)uVar61 ^ 0xf;
      pNVar51 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar58 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar63 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
      auVar172 = ZEXT1664(auVar63);
      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar173 = ZEXT1664(auVar63);
LAB_006a716c:
      do {
        auVar63 = auVar170._0_16_;
        do {
          root.ptr = pNVar51[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006a83ef;
          pNVar51 = pNVar51 + -1;
          vVar2.field_0 = paVar58[-1];
          paVar58 = paVar58 + -1;
          uVar61 = vcmpps_avx512vl((undefined1  [16])vVar2.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar61 == '\0');
        uVar57 = (undefined4)uVar61;
        if (uVar56 < (uint)POPCOUNT(uVar57)) {
LAB_006a71b4:
          auVar105 = ZEXT1664((undefined1  [16])vVar2.field_0);
          auVar63 = auVar170._0_16_;
          do {
            uVar160 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006a83ef;
              uVar11 = vcmpps_avx512vl(auVar105._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar11 != '\0') {
                uVar61 = (ulong)(uVar160 & 0xf);
                bVar43 = (byte)((ulong)local_19cc & 0xffffffffffffff0f);
                if (uVar61 != 8) {
                  uVar45 = (ulong)local_19cc & 0xffffffffffffff0f ^ 0xf;
                  uVar47 = 0;
                  do {
                    lVar49 = uVar47 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                    bVar43 = (byte)uVar45;
                    uVar14 = 0;
                    for (uVar50 = uVar45; (uVar50 & 1) == 0;
                        uVar50 = uVar50 >> 1 | 0x8000000000000000) {
                      uVar14 = uVar14 + 1;
                    }
                    uVar50 = 0;
                    uVar46 = uVar45;
                    while( true ) {
                      bVar52 = (byte)uVar46;
                      auVar86 = in_ZMM14._0_16_;
                      auVar63 = auVar172._0_16_;
                      auVar87 = in_ZMM20._0_16_;
                      auVar68 = auVar149._0_16_;
                      if (*(int *)(lVar49 + 0x50 + uVar50 * 4) == -1) break;
                      pGVar4 = (context->scene->geometries).items
                               [*(uint *)(lVar49 + 0x40 + uVar50 * 4)].ptr;
                      fVar95 = (pGVar4->time_range).lower;
                      auVar96._4_4_ = fVar95;
                      auVar96._0_4_ = fVar95;
                      auVar96._8_4_ = fVar95;
                      auVar96._12_4_ = fVar95;
                      fVar99 = pGVar4->fnumTimeSegments;
                      auVar109._4_4_ = fVar99;
                      auVar109._0_4_ = fVar99;
                      auVar109._8_4_ = fVar99;
                      auVar109._12_4_ = fVar99;
                      auVar65 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar96);
                      fVar95 = (pGVar4->time_range).upper - fVar95;
                      auVar97._4_4_ = fVar95;
                      auVar97._0_4_ = fVar95;
                      auVar97._8_4_ = fVar95;
                      auVar97._12_4_ = fVar95;
                      auVar64 = vdivps_avx(auVar65,auVar97);
                      auVar98._0_4_ = fVar99 * auVar64._0_4_;
                      auVar98._4_4_ = fVar99 * auVar64._4_4_;
                      auVar98._8_4_ = fVar99 * auVar64._8_4_;
                      auVar98._12_4_ = fVar99 * auVar64._12_4_;
                      auVar64 = vroundps_avx(auVar98,1);
                      auVar66 = vaddss_avx512f(auVar109,SUB6416(ZEXT464(0xbf800000),0));
                      auVar110._0_4_ = auVar66._0_4_;
                      auVar110._4_4_ = auVar110._0_4_;
                      auVar110._8_4_ = auVar110._0_4_;
                      auVar110._12_4_ = auVar110._0_4_;
                      auVar64 = vminps_avx(auVar64,auVar110);
                      auVar64 = vmaxps_avx512vl(auVar64,auVar63);
                      aVar10 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar64);
                      itime.field_0 = aVar10;
                      auVar64 = vsubps_avx(auVar98,auVar64);
                      auVar66 = vpbroadcastd_avx512vl();
                      uVar11 = vpcmpeqd_avx512vl(auVar66,(undefined1  [16])aVar10);
                      uVar12 = p1.field_0._24_8_;
                      if (((byte)uVar11 & 0xf | ~bVar43 & 0xf) == 0xf) {
                        lVar53 = (long)itime.field_0.i[uVar14] * 0x38;
                        lVar5 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar53);
                        lVar53 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 + lVar53);
                        uVar62 = (ulong)*(uint *)(lVar49 + uVar50 * 4);
                        uVar55 = (ulong)*(uint *)(lVar49 + 0x10 + uVar50 * 4);
                        auVar67 = vsubps_avx512vl(auVar169._0_16_,auVar64);
                        uVar57 = *(undefined4 *)(lVar53 + uVar62 * 4);
                        auVar16._4_4_ = uVar57;
                        auVar16._0_4_ = uVar57;
                        auVar16._8_4_ = uVar57;
                        auVar16._12_4_ = uVar57;
                        auVar68 = vmulps_avx512vl(auVar64,auVar16);
                        uVar57 = *(undefined4 *)(lVar53 + 4 + uVar62 * 4);
                        auVar17._4_4_ = uVar57;
                        auVar17._0_4_ = uVar57;
                        auVar17._8_4_ = uVar57;
                        auVar17._12_4_ = uVar57;
                        auVar65 = vmulps_avx512vl(auVar64,auVar17);
                        uVar57 = *(undefined4 *)(lVar53 + 8 + uVar62 * 4);
                        auVar18._4_4_ = uVar57;
                        auVar18._0_4_ = uVar57;
                        auVar18._8_4_ = uVar57;
                        auVar18._12_4_ = uVar57;
                        auVar66 = vmulps_avx512vl(auVar64,auVar18);
                        uVar57 = *(undefined4 *)(lVar5 + uVar62 * 4);
                        auVar19._4_4_ = uVar57;
                        auVar19._0_4_ = uVar57;
                        auVar19._8_4_ = uVar57;
                        auVar19._12_4_ = uVar57;
                        auVar73 = vfmadd231ps_avx512vl(auVar68,auVar67,auVar19);
                        uVar57 = *(undefined4 *)(lVar5 + 4 + uVar62 * 4);
                        auVar20._4_4_ = uVar57;
                        auVar20._0_4_ = uVar57;
                        auVar20._8_4_ = uVar57;
                        auVar20._12_4_ = uVar57;
                        auVar74 = vfmadd231ps_avx512vl(auVar65,auVar67,auVar20);
                        uVar57 = *(undefined4 *)(lVar5 + 8 + uVar62 * 4);
                        auVar21._4_4_ = uVar57;
                        auVar21._0_4_ = uVar57;
                        auVar21._8_4_ = uVar57;
                        auVar21._12_4_ = uVar57;
                        auVar75 = vfmadd231ps_avx512vl(auVar66,auVar67,auVar21);
                        uVar57 = *(undefined4 *)(lVar53 + uVar55 * 4);
                        auVar22._4_4_ = uVar57;
                        auVar22._0_4_ = uVar57;
                        auVar22._8_4_ = uVar57;
                        auVar22._12_4_ = uVar57;
                        auVar68 = vmulps_avx512vl(auVar64,auVar22);
                        uVar57 = *(undefined4 *)(lVar53 + 4 + uVar55 * 4);
                        auVar23._4_4_ = uVar57;
                        auVar23._0_4_ = uVar57;
                        auVar23._8_4_ = uVar57;
                        auVar23._12_4_ = uVar57;
                        auVar65 = vmulps_avx512vl(auVar64,auVar23);
                        uVar57 = *(undefined4 *)(lVar53 + 8 + uVar55 * 4);
                        auVar24._4_4_ = uVar57;
                        auVar24._0_4_ = uVar57;
                        auVar24._8_4_ = uVar57;
                        auVar24._12_4_ = uVar57;
                        auVar66 = vmulps_avx512vl(auVar64,auVar24);
                        uVar57 = *(undefined4 *)(lVar5 + uVar55 * 4);
                        auVar25._4_4_ = uVar57;
                        auVar25._0_4_ = uVar57;
                        auVar25._8_4_ = uVar57;
                        auVar25._12_4_ = uVar57;
                        auVar76 = vfmadd231ps_avx512vl(auVar68,auVar67,auVar25);
                        uVar57 = *(undefined4 *)(lVar5 + 4 + uVar55 * 4);
                        auVar26._4_4_ = uVar57;
                        auVar26._0_4_ = uVar57;
                        auVar26._8_4_ = uVar57;
                        auVar26._12_4_ = uVar57;
                        auVar77 = vfmadd231ps_avx512vl(auVar65,auVar67,auVar26);
                        uVar57 = *(undefined4 *)(lVar5 + 8 + uVar55 * 4);
                        auVar27._4_4_ = uVar57;
                        auVar27._0_4_ = uVar57;
                        auVar27._8_4_ = uVar57;
                        auVar27._12_4_ = uVar57;
                        auVar66 = vfmadd231ps_avx512vl(auVar66,auVar67,auVar27);
                        uVar62 = (ulong)*(uint *)(lVar49 + 0x20 + uVar50 * 4);
                        uVar57 = *(undefined4 *)(lVar53 + uVar62 * 4);
                        auVar28._4_4_ = uVar57;
                        auVar28._0_4_ = uVar57;
                        auVar28._8_4_ = uVar57;
                        auVar28._12_4_ = uVar57;
                        auVar68 = vmulps_avx512vl(auVar64,auVar28);
                        uVar57 = *(undefined4 *)(lVar53 + 4 + uVar62 * 4);
                        auVar29._4_4_ = uVar57;
                        auVar29._0_4_ = uVar57;
                        auVar29._8_4_ = uVar57;
                        auVar29._12_4_ = uVar57;
                        auVar65 = vmulps_avx512vl(auVar64,auVar29);
                        uVar57 = *(undefined4 *)(lVar53 + 8 + uVar62 * 4);
                        auVar30._4_4_ = uVar57;
                        auVar30._0_4_ = uVar57;
                        auVar30._8_4_ = uVar57;
                        auVar30._12_4_ = uVar57;
                        auVar78 = vmulps_avx512vl(auVar64,auVar30);
                        uVar57 = *(undefined4 *)(lVar5 + uVar62 * 4);
                        auVar31._4_4_ = uVar57;
                        auVar31._0_4_ = uVar57;
                        auVar31._8_4_ = uVar57;
                        auVar31._12_4_ = uVar57;
                        auVar79 = vfmadd231ps_avx512vl(auVar68,auVar67,auVar31);
                        uVar57 = *(undefined4 *)(lVar5 + 4 + uVar62 * 4);
                        auVar32._4_4_ = uVar57;
                        auVar32._0_4_ = uVar57;
                        auVar32._8_4_ = uVar57;
                        auVar32._12_4_ = uVar57;
                        auVar65 = vfmadd231ps_avx512vl(auVar65,auVar67,auVar32);
                        uVar57 = *(undefined4 *)(lVar5 + 8 + uVar62 * 4);
                        auVar33._4_4_ = uVar57;
                        auVar33._0_4_ = uVar57;
                        auVar33._8_4_ = uVar57;
                        auVar33._12_4_ = uVar57;
                        auVar68 = vfmadd231ps_avx512vl(auVar78,auVar67,auVar33);
                        uVar62 = (ulong)*(uint *)(lVar49 + 0x30 + uVar50 * 4);
                        uVar57 = *(undefined4 *)(lVar53 + uVar62 * 4);
                        auVar34._4_4_ = uVar57;
                        auVar34._0_4_ = uVar57;
                        auVar34._8_4_ = uVar57;
                        auVar34._12_4_ = uVar57;
                        auVar78 = vmulps_avx512vl(auVar64,auVar34);
                        uVar57 = *(undefined4 *)(lVar53 + 4 + uVar62 * 4);
                        auVar35._4_4_ = uVar57;
                        auVar35._0_4_ = uVar57;
                        auVar35._8_4_ = uVar57;
                        auVar35._12_4_ = uVar57;
                        auVar69 = vmulps_avx512vl(auVar64,auVar35);
                        uVar57 = *(undefined4 *)(lVar53 + 8 + uVar62 * 4);
                        auVar36._4_4_ = uVar57;
                        auVar36._0_4_ = uVar57;
                        auVar36._8_4_ = uVar57;
                        auVar36._12_4_ = uVar57;
                        auVar70 = vmulps_avx512vl(auVar64,auVar36);
                        uVar57 = *(undefined4 *)(lVar5 + uVar62 * 4);
                        auVar37._4_4_ = uVar57;
                        auVar37._0_4_ = uVar57;
                        auVar37._8_4_ = uVar57;
                        auVar37._12_4_ = uVar57;
                        auVar64 = vfmadd231ps_avx512vl(auVar78,auVar67,auVar37);
                        uVar57 = *(undefined4 *)(lVar5 + 4 + uVar62 * 4);
                        auVar38._4_4_ = uVar57;
                        auVar38._0_4_ = uVar57;
                        auVar38._8_4_ = uVar57;
                        auVar38._12_4_ = uVar57;
                        auVar80 = vfmadd231ps_avx512vl(auVar69,auVar67,auVar38);
                        uVar57 = *(undefined4 *)(lVar5 + 8 + uVar62 * 4);
                        auVar39._4_4_ = uVar57;
                        auVar39._0_4_ = uVar57;
                        auVar39._8_4_ = uVar57;
                        auVar39._12_4_ = uVar57;
                        auVar81 = vfmadd231ps_avx512vl(auVar70,auVar67,auVar39);
                      }
                      else {
                        uVar11 = p1.field_0._32_8_;
                        if (bVar43 != 0) {
                          lVar5 = *(long *)&pGVar4[2].numPrimitives;
                          uVar54 = (ulong)*(uint *)(lVar49 + uVar50 * 4);
                          uVar55 = uVar45;
                          uVar62 = uVar14;
                          do {
                            lVar53 = (long)itime.field_0.i[uVar62] * 0x38;
                            auVar65 = *(undefined1 (*) [16])(*(long *)(lVar5 + lVar53) + uVar54 * 4)
                            ;
                            auVar66 = *(undefined1 (*) [16])
                                       (*(long *)(lVar5 + 0x38 + lVar53) + uVar54 * 4);
                            *(int *)((long)&p0.field_0 + uVar62 * 4) = auVar65._0_4_;
                            uVar57 = vextractps_avx(auVar65,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar62 * 4 + 0x10) = uVar57;
                            uVar57 = vextractps_avx(auVar65,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar62 * 4 + 0x20) = uVar57;
                            *(int *)((long)&p1.field_0 + uVar62 * 4) = auVar66._0_4_;
                            uVar57 = vextractps_avx(auVar66,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar62 * 4 + 0x10) = uVar57;
                            uVar57 = vextractps_avx(auVar66,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar62 * 4 + 0x20) = uVar57;
                            uVar55 = uVar55 ^ 1L << (uVar62 & 0x3f);
                            uVar62 = 0;
                            for (uVar15 = uVar55; (uVar15 & 1) == 0;
                                uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                              uVar62 = uVar62 + 1;
                            }
                          } while (uVar55 != 0);
                          aVar10.v[1] = p1.field_0._8_8_;
                          aVar10.v[0] = p1.field_0._0_8_;
                          auVar65 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                          uVar11 = p1.field_0._32_8_;
                          uVar12 = p1.field_0._24_8_;
                        }
                        p1.field_0._28_4_ = (undefined4)((ulong)uVar12 >> 0x20);
                        p1.field_0._24_4_ = (undefined4)uVar12;
                        p1.field_0._36_4_ = (undefined4)((ulong)uVar11 >> 0x20);
                        p1.field_0._32_4_ = (undefined4)uVar11;
                        auVar67 = vsubps_avx512vl(auVar169._0_16_,auVar64);
                        fVar102 = auVar67._0_4_;
                        fVar115 = fVar102 * (float)p0.field_0._16_4_;
                        fVar106 = auVar67._4_4_;
                        fVar118 = fVar106 * (float)p0.field_0._20_4_;
                        fVar107 = auVar67._8_4_;
                        fVar119 = fVar107 * (float)p0.field_0._24_4_;
                        fVar108 = auVar67._12_4_;
                        fVar120 = fVar108 * (float)p0.field_0._28_4_;
                        fVar121 = fVar102 * (float)p0.field_0._32_4_;
                        fVar127 = fVar106 * (float)p0.field_0._36_4_;
                        fVar128 = fVar107 * (float)p0.field_0._40_4_;
                        fVar129 = fVar108 * (float)p0.field_0._44_4_;
                        fVar95 = auVar64._0_4_;
                        fVar130 = fVar95 * (float)p1.field_0._16_4_;
                        fVar99 = auVar64._4_4_;
                        fVar134 = fVar99 * (float)p1.field_0._20_4_;
                        fVar100 = auVar64._8_4_;
                        fVar135 = fVar100 * (float)p1.field_0._24_4_;
                        fVar101 = auVar64._12_4_;
                        fVar136 = fVar101 * (float)p1.field_0._28_4_;
                        fVar137 = fVar95 * (float)p1.field_0._32_4_;
                        fVar142 = fVar99 * (float)p1.field_0._36_4_;
                        fVar143 = fVar100 * (float)p1.field_0._40_4_;
                        fVar144 = fVar101 * (float)p1.field_0._44_4_;
                        auVar66 = auVar154._0_16_;
                        if (bVar43 != 0) {
                          lVar5 = *(long *)&pGVar4[2].numPrimitives;
                          uVar54 = (ulong)*(uint *)(lVar49 + 0x10 + uVar50 * 4);
                          uVar55 = uVar45;
                          uVar62 = uVar14;
                          p1.field_0._32_8_ = uVar11;
                          p1.field_0._24_8_ = uVar12;
                          do {
                            lVar53 = (long)itime.field_0.i[uVar62] * 0x38;
                            auVar68 = *(undefined1 (*) [16])(*(long *)(lVar5 + lVar53) + uVar54 * 4)
                            ;
                            auVar66 = *(undefined1 (*) [16])
                                       (*(long *)(lVar5 + 0x38 + lVar53) + uVar54 * 4);
                            *(int *)((long)&p0.field_0 + uVar62 * 4) = auVar68._0_4_;
                            uVar57 = vextractps_avx(auVar68,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar62 * 4 + 0x10) = uVar57;
                            uVar57 = vextractps_avx(auVar68,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar62 * 4 + 0x20) = uVar57;
                            *(int *)((long)&p1.field_0 + uVar62 * 4) = auVar66._0_4_;
                            uVar57 = vextractps_avx(auVar66,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar62 * 4 + 0x10) = uVar57;
                            uVar57 = vextractps_avx(auVar66,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar62 * 4 + 0x20) = uVar57;
                            uVar55 = uVar55 ^ 1L << (uVar62 & 0x3f);
                            uVar62 = 0;
                            for (uVar15 = uVar55; (uVar15 & 1) == 0;
                                uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                              uVar62 = uVar62 + 1;
                            }
                          } while (uVar55 != 0);
                          auVar68._8_8_ = p1.field_0._8_8_;
                          auVar68._0_8_ = p1.field_0._0_8_;
                          auVar66 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                          uVar11 = p1.field_0._32_8_;
                          uVar12 = p1.field_0._24_8_;
                        }
                        p1.field_0._28_4_ = (undefined4)((ulong)uVar12 >> 0x20);
                        p1.field_0._24_4_ = (undefined4)uVar12;
                        p1.field_0._36_4_ = (undefined4)((ulong)uVar11 >> 0x20);
                        p1.field_0._32_4_ = (undefined4)uVar11;
                        auVar155._0_4_ = fVar102 * (float)p0.field_0._16_4_;
                        auVar155._4_4_ = fVar106 * (float)p0.field_0._20_4_;
                        auVar155._8_4_ = fVar107 * (float)p0.field_0._24_4_;
                        auVar155._12_4_ = fVar108 * (float)p0.field_0._28_4_;
                        auVar157._0_4_ = fVar102 * (float)p0.field_0._32_4_;
                        auVar157._4_4_ = fVar106 * (float)p0.field_0._36_4_;
                        auVar157._8_4_ = fVar107 * (float)p0.field_0._40_4_;
                        auVar157._12_4_ = fVar108 * (float)p0.field_0._44_4_;
                        auVar158._0_4_ = fVar95 * (float)p1.field_0._16_4_;
                        auVar158._4_4_ = fVar99 * (float)p1.field_0._20_4_;
                        auVar158._8_4_ = fVar100 * (float)p1.field_0._24_4_;
                        auVar158._12_4_ = fVar101 * (float)p1.field_0._28_4_;
                        auVar162._0_4_ = fVar95 * (float)p1.field_0._32_4_;
                        auVar162._4_4_ = fVar99 * (float)p1.field_0._36_4_;
                        auVar162._8_4_ = fVar100 * (float)p1.field_0._40_4_;
                        auVar162._12_4_ = fVar101 * (float)p1.field_0._44_4_;
                        auVar78 = in_ZMM15._0_16_;
                        p1.field_0._32_8_ = uVar11;
                        if (bVar43 != 0) {
                          lVar5 = *(long *)&pGVar4[2].numPrimitives;
                          uVar54 = (ulong)*(uint *)(lVar49 + 0x20 + uVar50 * 4);
                          uVar55 = uVar45;
                          uVar62 = uVar14;
                          p1.field_0._24_8_ = uVar12;
                          do {
                            lVar53 = (long)itime.field_0.i[uVar62] * 0x38;
                            auVar78 = *(undefined1 (*) [16])(*(long *)(lVar5 + lVar53) + uVar54 * 4)
                            ;
                            auVar69 = *(undefined1 (*) [16])
                                       (*(long *)(lVar5 + 0x38 + lVar53) + uVar54 * 4);
                            *(int *)((long)&p0.field_0 + uVar62 * 4) = auVar78._0_4_;
                            uVar57 = vextractps_avx(auVar78,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar62 * 4 + 0x10) = uVar57;
                            uVar57 = vextractps_avx(auVar78,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar62 * 4 + 0x20) = uVar57;
                            *(int *)((long)&p1.field_0 + uVar62 * 4) = auVar69._0_4_;
                            uVar57 = vextractps_avx(auVar69,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar62 * 4 + 0x10) = uVar57;
                            uVar57 = vextractps_avx(auVar69,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar62 * 4 + 0x20) = uVar57;
                            uVar55 = uVar55 ^ 1L << (uVar62 & 0x3f);
                            uVar62 = 0;
                            for (uVar15 = uVar55; (uVar15 & 1) == 0;
                                uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                              uVar62 = uVar62 + 1;
                            }
                          } while (uVar55 != 0);
                          auVar86._8_8_ = p1.field_0._8_8_;
                          auVar86._0_8_ = p1.field_0._0_8_;
                          auVar78 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                          uVar12 = p1.field_0._24_8_;
                        }
                        p1.field_0._28_4_ = (undefined4)((ulong)uVar12 >> 0x20);
                        p1.field_0._24_4_ = (undefined4)uVar12;
                        auVar70 = vmulps_avx512vl(auVar67,(undefined1  [16])
                                                          p0.field_0.field_0.y.field_0);
                        auVar71 = vmulps_avx512vl(auVar67,(undefined1  [16])
                                                          p0.field_0.field_0.z.field_0);
                        auVar40._4_4_ = p1.field_0._20_4_;
                        auVar40._0_4_ = p1.field_0._16_4_;
                        auVar40._8_4_ = p1.field_0._24_4_;
                        auVar40._12_4_ = p1.field_0._28_4_;
                        auVar72 = vmulps_avx512vl(auVar64,auVar40);
                        auVar41._8_4_ = p1.field_0._40_4_;
                        auVar41._0_8_ = p1.field_0._32_8_;
                        auVar41._12_4_ = p1.field_0._44_4_;
                        auVar90 = vmulps_avx512vl(auVar64,auVar41);
                        auVar69 = (undefined1  [16])in_ZMM21._0_16_;
                        uVar11 = p1.field_0._32_8_;
                        if (bVar43 != 0) {
                          lVar5 = *(long *)&pGVar4[2].numPrimitives;
                          uVar54 = (ulong)*(uint *)(lVar49 + 0x30 + uVar50 * 4);
                          uVar55 = uVar45;
                          uVar62 = uVar14;
                          p1.field_0._24_8_ = uVar12;
                          do {
                            lVar53 = (long)itime.field_0.i[uVar62] * 0x38;
                            auVar69 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                          (*(long *)(lVar5 + lVar53) + uVar54 * 4));
                            auVar77 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                          (*(long *)(lVar5 + 0x38 + lVar53) +
                                                          uVar54 * 4));
                            *(int *)((long)&p0.field_0 + uVar62 * 4) = auVar69._0_4_;
                            uVar57 = vextractps_avx512f(auVar69,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar62 * 4 + 0x10) = uVar57;
                            uVar57 = vextractps_avx512f(auVar69,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar62 * 4 + 0x20) = uVar57;
                            *(int *)((long)&p1.field_0 + uVar62 * 4) = auVar77._0_4_;
                            uVar57 = vextractps_avx512f(auVar77,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar62 * 4 + 0x10) = uVar57;
                            uVar57 = vextractps_avx512f(auVar77,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar62 * 4 + 0x20) = uVar57;
                            uVar55 = uVar55 ^ 1L << (uVar62 & 0x3f);
                            uVar62 = 0;
                            for (uVar15 = uVar55; (uVar15 & 1) == 0;
                                uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                              uVar62 = uVar62 + 1;
                            }
                          } while (uVar55 != 0);
                          auVar87._8_8_ = p1.field_0._8_8_;
                          auVar87._0_8_ = p1.field_0._0_8_;
                          auVar69 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                          uVar11 = p1.field_0._32_8_;
                          uVar12 = p1.field_0._24_8_;
                        }
                        p1.field_0._28_4_ = (undefined4)((ulong)uVar12 >> 0x20);
                        p1.field_0._24_4_ = (undefined4)uVar12;
                        p1.field_0._36_4_ = (undefined4)((ulong)uVar11 >> 0x20);
                        p1.field_0._32_4_ = (undefined4)uVar11;
                        auVar73._0_4_ = fVar102 * auVar65._0_4_ + fVar95 * aVar10.i[0];
                        auVar73._4_4_ = fVar106 * auVar65._4_4_ + fVar99 * aVar10.i[1];
                        auVar73._8_4_ = fVar107 * auVar65._8_4_ + fVar100 * aVar10.i[2];
                        auVar73._12_4_ = fVar108 * auVar65._12_4_ + fVar101 * aVar10.i[3];
                        auVar74._0_4_ = fVar115 + fVar130;
                        auVar74._4_4_ = fVar118 + fVar134;
                        auVar74._8_4_ = fVar119 + fVar135;
                        auVar74._12_4_ = fVar120 + fVar136;
                        auVar75._0_4_ = fVar121 + fVar137;
                        auVar75._4_4_ = fVar127 + fVar142;
                        auVar75._8_4_ = fVar128 + fVar143;
                        auVar75._12_4_ = fVar129 + fVar144;
                        auVar112._0_4_ = auVar66._0_4_ * fVar102;
                        auVar112._4_4_ = auVar66._4_4_ * fVar106;
                        auVar112._8_4_ = auVar66._8_4_ * fVar107;
                        auVar112._12_4_ = auVar66._12_4_ * fVar108;
                        auVar131._0_4_ = auVar68._0_4_ * fVar95;
                        auVar131._4_4_ = auVar68._4_4_ * fVar99;
                        auVar131._8_4_ = auVar68._8_4_ * fVar100;
                        auVar131._12_4_ = auVar68._12_4_ * fVar101;
                        auVar76 = vaddps_avx512vl(auVar112,auVar131);
                        auVar77 = vaddps_avx512vl(auVar155,auVar158);
                        auVar66 = vaddps_avx512vl(auVar157,auVar162);
                        auVar79._0_4_ = auVar78._0_4_ * fVar102 + auVar86._0_4_ * fVar95;
                        auVar79._4_4_ = auVar78._4_4_ * fVar106 + auVar86._4_4_ * fVar99;
                        auVar79._8_4_ = auVar78._8_4_ * fVar107 + auVar86._8_4_ * fVar100;
                        auVar79._12_4_ = auVar78._12_4_ * fVar108 + auVar86._12_4_ * fVar101;
                        auVar65 = vaddps_avx512vl(auVar70,auVar72);
                        auVar68 = vaddps_avx512vl(auVar71,auVar90);
                        auVar67 = vmulps_avx512vl(auVar67,auVar69);
                        auVar64 = vmulps_avx512vl(auVar64,auVar87);
                        auVar64 = vaddps_avx512vl(auVar67,auVar64);
                        auVar80._0_4_ =
                             fVar102 * (float)p0.field_0._16_4_ + fVar95 * (float)p1.field_0._16_4_;
                        auVar80._4_4_ =
                             fVar106 * (float)p0.field_0._20_4_ + fVar99 * (float)p1.field_0._20_4_;
                        auVar80._8_4_ =
                             fVar107 * (float)p0.field_0._24_4_ + fVar100 * (float)p1.field_0._24_4_
                        ;
                        auVar80._12_4_ =
                             fVar108 * (float)p0.field_0._28_4_ + fVar101 * (float)p1.field_0._28_4_
                        ;
                        auVar81._0_4_ =
                             fVar102 * (float)p0.field_0._32_4_ + fVar95 * (float)p1.field_0._32_4_;
                        auVar81._4_4_ =
                             fVar106 * (float)p0.field_0._36_4_ + fVar99 * (float)p1.field_0._36_4_;
                        auVar81._8_4_ =
                             fVar107 * (float)p0.field_0._40_4_ + fVar100 * (float)p1.field_0._40_4_
                        ;
                        auVar81._12_4_ =
                             fVar108 * (float)p0.field_0._44_4_ + fVar101 * (float)p1.field_0._44_4_
                        ;
                        p1.field_0._32_8_ = uVar11;
                      }
                      auVar82 = vsubps_avx512vl(auVar73,auVar76);
                      auVar83 = vsubps_avx512vl(auVar74,auVar77);
                      auVar84 = vsubps_avx512vl(auVar75,auVar66);
                      auVar85 = vsubps_avx512vl(auVar64,auVar73);
                      in_ZMM15 = ZEXT1664(auVar85);
                      auVar86 = vsubps_avx512vl(auVar80,auVar74);
                      auVar87 = vsubps_avx512vl(auVar81,auVar75);
                      auVar67 = vmulps_avx512vl(auVar83,auVar87);
                      vVar88.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vfmsub231ps_avx512vl(auVar67,auVar86,auVar84);
                      auVar103._0_4_ = auVar84._0_4_ * auVar85._0_4_;
                      auVar103._4_4_ = auVar84._4_4_ * auVar85._4_4_;
                      auVar103._8_4_ = auVar84._8_4_ * auVar85._8_4_;
                      auVar103._12_4_ = auVar84._12_4_ * auVar85._12_4_;
                      vVar89.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vfmsub231ps_avx512vl(auVar103,auVar87,auVar82);
                      auVar67 = vmulps_avx512vl(auVar82,auVar86);
                      auVar90 = vfmsub231ps_fma(auVar67,auVar85,auVar83);
                      auVar70 = vsubps_avx(auVar73,*(undefined1 (*) [16])ray);
                      auVar71 = vsubps_avx(auVar74,*(undefined1 (*) [16])(ray + 0x10));
                      auVar72 = vsubps_avx(auVar75,*(undefined1 (*) [16])(ray + 0x20));
                      auVar154 = ZEXT1664(auVar72);
                      auVar67 = *(undefined1 (*) [16])(ray + 0x40);
                      auVar78 = *(undefined1 (*) [16])(ray + 0x50);
                      auVar69 = *(undefined1 (*) [16])(ray + 0x60);
                      auVar116._0_4_ = auVar78._0_4_ * auVar72._0_4_;
                      auVar116._4_4_ = auVar78._4_4_ * auVar72._4_4_;
                      auVar116._8_4_ = auVar78._8_4_ * auVar72._8_4_;
                      auVar116._12_4_ = auVar78._12_4_ * auVar72._12_4_;
                      auVar91 = vfmsub231ps_fma(auVar116,auVar71,auVar69);
                      auVar122._0_4_ = auVar69._0_4_ * auVar70._0_4_;
                      auVar122._4_4_ = auVar69._4_4_ * auVar70._4_4_;
                      auVar122._8_4_ = auVar69._8_4_ * auVar70._8_4_;
                      auVar122._12_4_ = auVar69._12_4_ * auVar70._12_4_;
                      auVar92 = vfmsub231ps_fma(auVar122,auVar72,auVar67);
                      auVar166._0_4_ = auVar67._0_4_ * auVar71._0_4_;
                      auVar166._4_4_ = auVar67._4_4_ * auVar71._4_4_;
                      auVar166._8_4_ = auVar67._8_4_ * auVar71._8_4_;
                      auVar166._12_4_ = auVar67._12_4_ * auVar71._12_4_;
                      auVar93 = vfmsub231ps_fma(auVar166,auVar70,auVar78);
                      in_ZMM14 = ZEXT1664(auVar93);
                      auVar145._0_4_ = auVar69._0_4_ * auVar90._0_4_;
                      auVar145._4_4_ = auVar69._4_4_ * auVar90._4_4_;
                      auVar145._8_4_ = auVar69._8_4_ * auVar90._8_4_;
                      auVar145._12_4_ = auVar69._12_4_ * auVar90._12_4_;
                      auVar78 = vfmadd231ps_fma(auVar145,(undefined1  [16])vVar89.field_0,auVar78);
                      auVar67 = vfmadd231ps_fma(auVar78,(undefined1  [16])vVar88.field_0,auVar67);
                      auVar149 = ZEXT1664(auVar67);
                      auVar69 = vandps_avx512vl(auVar67,auVar173._0_16_);
                      auVar78 = vmulps_avx512vl(auVar87,auVar93);
                      auVar78 = vfmadd231ps_avx512vl(auVar78,auVar92,auVar86);
                      auVar78 = vfmadd231ps_fma(auVar78,auVar91,auVar85);
                      uVar160 = auVar69._0_4_;
                      auVar113._0_4_ = (float)(uVar160 ^ auVar78._0_4_);
                      uVar163 = auVar69._4_4_;
                      auVar113._4_4_ = (float)(uVar163 ^ auVar78._4_4_);
                      uVar164 = auVar69._8_4_;
                      auVar113._8_4_ = (float)(uVar164 ^ auVar78._8_4_);
                      uVar165 = auVar69._12_4_;
                      auVar113._12_4_ = (float)(uVar165 ^ auVar78._12_4_);
                      uVar11 = vcmpps_avx512vl(auVar113,auVar63,5);
                      bVar48 = (byte)uVar11 & bVar52;
                      p1.field_0._24_8_ = uVar12;
                      if (bVar48 != 0) {
                        auVar159._0_4_ = auVar84._0_4_ * auVar93._0_4_;
                        auVar159._4_4_ = auVar84._4_4_ * auVar93._4_4_;
                        auVar159._8_4_ = auVar84._8_4_ * auVar93._8_4_;
                        auVar159._12_4_ = auVar84._12_4_ * auVar93._12_4_;
                        auVar78 = vfmadd213ps_fma(auVar83,auVar92,auVar159);
                        auVar78 = vfmadd213ps_fma(auVar82,auVar91,auVar78);
                        auVar123._0_4_ = (float)(uVar160 ^ auVar78._0_4_);
                        auVar123._4_4_ = (float)(uVar163 ^ auVar78._4_4_);
                        auVar123._8_4_ = (float)(uVar164 ^ auVar78._8_4_);
                        auVar123._12_4_ = (float)(uVar165 ^ auVar78._12_4_);
                        uVar11 = vcmpps_avx512vl(auVar123,auVar63,5);
                        bVar48 = bVar48 & (byte)uVar11;
                        if (bVar48 != 0) {
                          auVar69 = vandps_avx512vl(auVar67,auVar168._0_16_);
                          auVar78 = vsubps_avx(auVar69,auVar113);
                          uVar11 = vcmpps_avx512vl(auVar78,auVar123,5);
                          bVar48 = bVar48 & (byte)uVar11;
                          if (bVar48 != 0) {
                            auVar152._0_4_ = auVar72._0_4_ * auVar90._0_4_;
                            auVar152._4_4_ = auVar72._4_4_ * auVar90._4_4_;
                            auVar152._8_4_ = auVar72._8_4_ * auVar90._8_4_;
                            auVar152._12_4_ = auVar72._12_4_ * auVar90._12_4_;
                            auVar78 = vfmadd213ps_fma(auVar71,(undefined1  [16])vVar89.field_0,
                                                      auVar152);
                            auVar78 = vfmadd213ps_fma(auVar70,(undefined1  [16])vVar88.field_0,
                                                      auVar78);
                            auVar133._0_4_ = uVar160 ^ auVar78._0_4_;
                            auVar133._4_4_ = uVar163 ^ auVar78._4_4_;
                            auVar133._8_4_ = uVar164 ^ auVar78._8_4_;
                            auVar133._12_4_ = uVar165 ^ auVar78._12_4_;
                            auVar140._0_4_ = auVar69._0_4_ * *(float *)(ray + 0x30);
                            auVar140._4_4_ = auVar69._4_4_ * *(float *)(ray + 0x34);
                            auVar140._8_4_ = auVar69._8_4_ * *(float *)(ray + 0x38);
                            auVar140._12_4_ = auVar69._12_4_ * *(float *)(ray + 0x3c);
                            fVar95 = *(float *)(ray + 0x80);
                            fVar99 = *(float *)(ray + 0x84);
                            fVar100 = *(float *)(ray + 0x88);
                            fVar101 = *(float *)(ray + 0x8c);
                            auVar153._0_4_ = fVar95 * auVar69._0_4_;
                            auVar153._4_4_ = fVar99 * auVar69._4_4_;
                            auVar153._8_4_ = fVar100 * auVar69._8_4_;
                            auVar153._12_4_ = fVar101 * auVar69._12_4_;
                            auVar154 = ZEXT1664(auVar153);
                            uVar11 = vcmpps_avx512vl(auVar133,auVar153,2);
                            uVar13 = vcmpps_avx512vl(auVar140,auVar133,1);
                            bVar48 = bVar48 & (byte)uVar11 & (byte)uVar13;
                            if (bVar48 == 0) {
LAB_006a7eb5:
                              auVar67 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar78 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                              auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                              auVar63 = vxorps_avx512vl(auVar63,auVar63);
                              auVar71 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            }
                            else {
                              uVar11 = vcmpps_avx512vl(auVar67,ZEXT816(0) << 0x20,4);
                              bVar48 = bVar48 & (byte)uVar11;
                              if (bVar48 == 0) goto LAB_006a7eb5;
                              uVar160 = pGVar4->mask;
                              auVar141._4_4_ = uVar160;
                              auVar141._0_4_ = uVar160;
                              auVar141._8_4_ = uVar160;
                              auVar141._12_4_ = uVar160;
                              uVar11 = vptestmd_avx512vl(auVar141,*(undefined1 (*) [16])(ray + 0x90)
                                                        );
                              bVar48 = bVar48 & (byte)uVar11 & 0xf;
                              uVar62 = (ulong)bVar48;
                              if (bVar48 == 0) goto LAB_006a7eb5;
                              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                 (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                auVar78 = vrcp14ps_avx512vl(auVar69);
                                auVar148._8_4_ = 0x3f800000;
                                auVar148._0_8_ = 0x3f8000003f800000;
                                auVar148._12_4_ = 0x3f800000;
                                auVar67 = vfnmadd213ps_fma(auVar69,auVar78,auVar148);
                                auVar67 = vfmadd132ps_fma(auVar67,auVar78,auVar78);
                                auVar114._0_4_ = auVar67._0_4_ * auVar113._0_4_;
                                auVar114._4_4_ = auVar67._4_4_ * auVar113._4_4_;
                                auVar114._8_4_ = auVar67._8_4_ * auVar113._8_4_;
                                auVar114._12_4_ = auVar67._12_4_ * auVar113._12_4_;
                                vminps_avx(auVar114,auVar148);
                                auVar126._0_4_ = auVar67._0_4_ * auVar123._0_4_;
                                auVar126._4_4_ = auVar67._4_4_ * auVar123._4_4_;
                                auVar126._8_4_ = auVar67._8_4_ * auVar123._8_4_;
                                auVar126._12_4_ = auVar67._12_4_ * auVar123._12_4_;
                                vminps_avx(auVar126,auVar148);
                                vpbroadcastd_avx512vl();
                                auVar78 = vpbroadcastd_avx512vl();
                                auVar149 = ZEXT1664(auVar78);
                                p0.field_0.field_0.x.field_0 =
                                     (vfloat_impl<4>)(vfloat_impl<4>)vVar88.field_0;
                                p0.field_0.field_0.y.field_0 =
                                     (vfloat_impl<4>)(vfloat_impl<4>)vVar89.field_0;
                                p0.field_0._32_16_ = auVar90;
                                vpcmpeqd_avx2(ZEXT1632((undefined1  [16])vVar88.field_0),
                                              ZEXT1632((undefined1  [16])vVar88.field_0));
                                auVar67 = vmulps_avx512vl(auVar67,auVar133);
                                bVar59 = (bool)(bVar48 >> 1 & 1);
                                bVar7 = (bool)(bVar48 >> 2 & 1);
                                *(uint *)(ray + 0x80) =
                                     (uint)(bVar48 & 1) * auVar67._0_4_ |
                                     (uint)!(bool)(bVar48 & 1) * (int)fVar95;
                                *(uint *)(ray + 0x84) =
                                     (uint)bVar59 * auVar67._4_4_ | (uint)!bVar59 * (int)fVar99;
                                *(uint *)(ray + 0x88) =
                                     (uint)bVar7 * auVar67._8_4_ | (uint)!bVar7 * (int)fVar100;
                                *(uint *)(ray + 0x8c) =
                                     (uint)(bVar48 >> 3) * auVar67._12_4_ |
                                     (uint)!(bool)(bVar48 >> 3) * (int)fVar101;
                                itime.field_0 =
                                     (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                     vpmovm2d_avx512vl((ulong)bVar48);
                                p1.field_0._0_8_ = &itime;
                                p1.field_0._8_8_ = pGVar4->userPtr;
                                p1.field_0._16_4_ = SUB84(context->user,0);
                                p1.field_0._20_4_ = (undefined4)((ulong)context->user >> 0x20);
                                p1.field_0._32_4_ = SUB84(&p0,0);
                                p1.field_0._36_4_ = (undefined4)((ulong)&p0 >> 0x20);
                                p1.field_0._40_4_ = 4;
                                p1.field_0._32_8_ = &p0;
                                uVar12 = ray;
                                if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                  auVar149 = ZEXT1664(auVar78);
                                  auVar154 = ZEXT1664(auVar153);
                                  in_ZMM14 = ZEXT1664(auVar93);
                                  in_ZMM15 = ZEXT1664(auVar85);
                                  p1.field_0._24_8_ = ray;
                                  (*pGVar4->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                                  uVar12 = p1.field_0._24_8_;
                                }
                                uVar46 = vptestmd_avx512vl((undefined1  [16])itime.field_0,
                                                           (undefined1  [16])itime.field_0);
                                if ((uVar46 & 0xf) == 0) {
                                  uVar62 = 0;
                                }
                                else {
                                  p_Var6 = context->args->filter;
                                  if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                    auVar149 = ZEXT1664(auVar149._0_16_);
                                    auVar154 = ZEXT1664(auVar154._0_16_);
                                    in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                    in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                                    p1.field_0._24_8_ = uVar12;
                                    (*p_Var6)((RTCFilterFunctionNArguments *)&p1);
                                    uVar12 = p1.field_0._24_8_;
                                  }
                                  uVar62 = vptestmd_avx512vl((undefined1  [16])itime.field_0,
                                                             (undefined1  [16])itime.field_0);
                                  uVar62 = uVar62 & 0xf;
                                  auVar67 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                  bVar59 = (bool)((byte)uVar62 & 1);
                                  bVar7 = (bool)((byte)(uVar62 >> 1) & 1);
                                  bVar8 = (bool)((byte)(uVar62 >> 2) & 1);
                                  bVar9 = SUB81(uVar62 >> 3,0);
                                  *(uint *)(uVar12 + 0x80) =
                                       (uint)bVar59 * auVar67._0_4_ |
                                       (uint)!bVar59 * *(int *)(uVar12 + 0x80);
                                  *(uint *)(uVar12 + 0x84) =
                                       (uint)bVar7 * auVar67._4_4_ |
                                       (uint)!bVar7 * *(int *)(uVar12 + 0x84);
                                  *(uint *)(uVar12 + 0x88) =
                                       (uint)bVar8 * auVar67._8_4_ |
                                       (uint)!bVar8 * *(int *)(uVar12 + 0x88);
                                  *(uint *)(uVar12 + 0x8c) =
                                       (uint)bVar9 * auVar67._12_4_ |
                                       (uint)!bVar9 * *(int *)(uVar12 + 0x8c);
                                }
                                bVar59 = (bool)((byte)uVar62 & 1);
                                bVar7 = (bool)((byte)(uVar62 >> 1) & 1);
                                bVar8 = (bool)((byte)(uVar62 >> 2) & 1);
                                bVar9 = SUB81(uVar62 >> 3,0);
                                *(uint *)pRVar1 =
                                     (uint)bVar59 * *(int *)pRVar1 | (uint)!bVar59 * (int)fVar95;
                                *(uint *)(ray + 0x84) =
                                     (uint)bVar7 * *(int *)(ray + 0x84) | (uint)!bVar7 * (int)fVar99
                                ;
                                *(uint *)(ray + 0x88) =
                                     (uint)bVar8 * *(int *)(ray + 0x88) |
                                     (uint)!bVar8 * (int)fVar100;
                                *(uint *)(ray + 0x8c) =
                                     (uint)bVar9 * *(int *)(ray + 0x8c) |
                                     (uint)!bVar9 * (int)fVar101;
                              }
                              uVar46 = (ulong)(((byte)uVar62 ^ 0xf) & bVar52);
                              auVar67 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar78 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                              auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                              auVar63 = vxorps_avx512vl(auVar63,auVar63);
                              auVar71 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            }
                            auVar173 = ZEXT1664(auVar71);
                            auVar172 = ZEXT1664(auVar63);
                            auVar171 = ZEXT1664(auVar70);
                            auVar170 = ZEXT1664(auVar69);
                            auVar169 = ZEXT1664(auVar78);
                            auVar168 = ZEXT1664(auVar67);
                            p1.field_0._24_8_ = uVar12;
                          }
                        }
                      }
                      in_ZMM21 = ZEXT1664(auVar64);
                      in_ZMM20 = ZEXT1664(auVar68);
                      auVar63 = auVar172._0_16_;
                      bVar52 = (byte)uVar46;
                      if (bVar52 == 0) {
                        bVar52 = 0;
                        break;
                      }
                      auVar69 = vsubps_avx512vl(auVar79,auVar64);
                      auVar70 = vsubps_avx512vl(auVar65,auVar80);
                      auVar71 = vsubps_avx512vl(auVar68,auVar81);
                      auVar72 = vsubps_avx512vl(auVar76,auVar79);
                      auVar90 = vsubps_avx512vl(auVar77,auVar65);
                      in_ZMM15 = ZEXT1664(auVar90);
                      auVar77 = vsubps_avx512vl(auVar66,auVar68);
                      auVar64 = vmulps_avx512vl(auVar70,auVar77);
                      vVar88.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vfmsub231ps_fma(auVar64,auVar90,auVar71);
                      auVar104._0_4_ = auVar71._0_4_ * auVar72._0_4_;
                      auVar104._4_4_ = auVar71._4_4_ * auVar72._4_4_;
                      auVar104._8_4_ = auVar71._8_4_ * auVar72._8_4_;
                      auVar104._12_4_ = auVar71._12_4_ * auVar72._12_4_;
                      vVar89.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vfmsub231ps_avx512vl(auVar104,auVar77,auVar69);
                      auVar111._0_4_ = auVar90._0_4_ * auVar69._0_4_;
                      auVar111._4_4_ = auVar90._4_4_ * auVar69._4_4_;
                      auVar111._8_4_ = auVar90._8_4_ * auVar69._8_4_;
                      auVar111._12_4_ = auVar90._12_4_ * auVar69._12_4_;
                      auVar66 = vfmsub231ps_fma(auVar111,auVar72,auVar70);
                      auVar76 = vsubps_avx512vl(auVar79,*(undefined1 (*) [16])ray);
                      auVar91 = vsubps_avx512vl(auVar65,*(undefined1 (*) [16])(ray + 0x10));
                      auVar92 = vsubps_avx512vl(auVar68,*(undefined1 (*) [16])(ray + 0x20));
                      auVar154 = ZEXT1664(auVar92);
                      auVar68 = *(undefined1 (*) [16])(ray + 0x40);
                      auVar64 = *(undefined1 (*) [16])(ray + 0x50);
                      auVar65 = *(undefined1 (*) [16])(ray + 0x60);
                      auVar67 = vmulps_avx512vl(auVar64,auVar92);
                      auVar67 = vfmsub231ps_fma(auVar67,auVar91,auVar65);
                      auVar161._0_4_ = auVar65._0_4_ * auVar76._0_4_;
                      auVar161._4_4_ = auVar65._4_4_ * auVar76._4_4_;
                      auVar161._8_4_ = auVar65._8_4_ * auVar76._8_4_;
                      auVar161._12_4_ = auVar65._12_4_ * auVar76._12_4_;
                      auVar78 = vfmsub231ps_fma(auVar161,auVar92,auVar68);
                      auVar167._0_4_ = auVar68._0_4_ * auVar91._0_4_;
                      auVar167._4_4_ = auVar68._4_4_ * auVar91._4_4_;
                      auVar167._8_4_ = auVar68._8_4_ * auVar91._8_4_;
                      auVar167._12_4_ = auVar68._12_4_ * auVar91._12_4_;
                      auVar93 = vfmsub231ps_avx512vl(auVar167,auVar76,auVar64);
                      in_ZMM14 = ZEXT1664(auVar93);
                      auVar146._0_4_ = auVar65._0_4_ * auVar66._0_4_;
                      auVar146._4_4_ = auVar65._4_4_ * auVar66._4_4_;
                      auVar146._8_4_ = auVar65._8_4_ * auVar66._8_4_;
                      auVar146._12_4_ = auVar65._12_4_ * auVar66._12_4_;
                      auVar64 = vfmadd231ps_avx512vl
                                          (auVar146,(undefined1  [16])vVar89.field_0,auVar64);
                      auVar68 = vfmadd231ps_fma(auVar64,(undefined1  [16])vVar88.field_0,auVar68);
                      auVar149 = ZEXT1664(auVar68);
                      auVar64 = vandps_avx512vl(auVar68,auVar173._0_16_);
                      auVar65 = vmulps_avx512vl(auVar77,auVar93);
                      auVar65 = vfmadd231ps_avx512vl(auVar65,auVar78,auVar90);
                      auVar65 = vfmadd231ps_avx512vl(auVar65,auVar67,auVar72);
                      auVar65 = vxorps_avx512vl(auVar64,auVar65);
                      uVar11 = vcmpps_avx512vl(auVar65,auVar63,5);
                      bVar48 = (byte)uVar11 & bVar52;
                      if (bVar48 != 0) {
                        auVar156._0_4_ = auVar71._0_4_ * auVar93._0_4_;
                        auVar156._4_4_ = auVar71._4_4_ * auVar93._4_4_;
                        auVar156._8_4_ = auVar71._8_4_ * auVar93._8_4_;
                        auVar156._12_4_ = auVar71._12_4_ * auVar93._12_4_;
                        auVar78 = vfmadd213ps_fma(auVar70,auVar78,auVar156);
                        auVar67 = vfmadd213ps_fma(auVar69,auVar67,auVar78);
                        auVar124._0_4_ = (float)(auVar64._0_4_ ^ auVar67._0_4_);
                        auVar124._4_4_ = (float)(auVar64._4_4_ ^ auVar67._4_4_);
                        auVar124._8_4_ = (float)(auVar64._8_4_ ^ auVar67._8_4_);
                        auVar124._12_4_ = (float)(auVar64._12_4_ ^ auVar67._12_4_);
                        uVar11 = vcmpps_avx512vl(auVar124,auVar63,5);
                        bVar48 = bVar48 & (byte)uVar11;
                        if (bVar48 != 0) {
                          auVar78 = vandps_avx512vl(auVar68,auVar168._0_16_);
                          auVar67 = vsubps_avx(auVar78,auVar65);
                          uVar11 = vcmpps_avx512vl(auVar67,auVar124,5);
                          bVar48 = bVar48 & (byte)uVar11;
                          if (bVar48 != 0) {
                            auVar150._0_4_ = auVar92._0_4_ * auVar66._0_4_;
                            auVar150._4_4_ = auVar92._4_4_ * auVar66._4_4_;
                            auVar150._8_4_ = auVar92._8_4_ * auVar66._8_4_;
                            auVar150._12_4_ = auVar92._12_4_ * auVar66._12_4_;
                            auVar67 = vfmadd213ps_fma(auVar91,(undefined1  [16])vVar89.field_0,
                                                      auVar150);
                            auVar67 = vfmadd213ps_fma(auVar76,(undefined1  [16])vVar88.field_0,
                                                      auVar67);
                            auVar132._0_4_ = auVar64._0_4_ ^ auVar67._0_4_;
                            auVar132._4_4_ = auVar64._4_4_ ^ auVar67._4_4_;
                            auVar132._8_4_ = auVar64._8_4_ ^ auVar67._8_4_;
                            auVar132._12_4_ = auVar64._12_4_ ^ auVar67._12_4_;
                            auVar138._0_4_ = auVar78._0_4_ * *(float *)(ray + 0x30);
                            auVar138._4_4_ = auVar78._4_4_ * *(float *)(ray + 0x34);
                            auVar138._8_4_ = auVar78._8_4_ * *(float *)(ray + 0x38);
                            auVar138._12_4_ = auVar78._12_4_ * *(float *)(ray + 0x3c);
                            auVar42 = *(undefined1 (*) [12])(ray + 0x80);
                            fVar95 = *(float *)(ray + 0x8c);
                            auVar151._0_4_ = *(float *)(ray + 0x80) * auVar78._0_4_;
                            auVar151._4_4_ = *(float *)(ray + 0x84) * auVar78._4_4_;
                            auVar151._8_4_ = *(float *)(ray + 0x88) * auVar78._8_4_;
                            auVar151._12_4_ = fVar95 * auVar78._12_4_;
                            auVar154 = ZEXT1664(auVar151);
                            uVar11 = vcmpps_avx512vl(auVar132,auVar151,2);
                            uVar12 = vcmpps_avx512vl(auVar138,auVar132,1);
                            bVar48 = bVar48 & (byte)uVar11 & (byte)uVar12;
                            if (bVar48 != 0) {
                              uVar11 = vcmpps_avx512vl(auVar68,ZEXT816(0) << 0x20,4);
                              bVar48 = bVar48 & (byte)uVar11;
                              if (bVar48 != 0) {
                                pGVar4 = (context->scene->geometries).items
                                         [*(uint *)(lVar49 + 0x40 + uVar50 * 4)].ptr;
                                uVar160 = pGVar4->mask;
                                auVar139._4_4_ = uVar160;
                                auVar139._0_4_ = uVar160;
                                auVar139._8_4_ = uVar160;
                                auVar139._12_4_ = uVar160;
                                uVar11 = vptestmd_avx512vl(auVar139,*(undefined1 (*) [16])
                                                                     (ray + 0x90));
                                bVar48 = bVar48 & (byte)uVar11 & 0xf;
                                uVar62 = (ulong)bVar48;
                                if (bVar48 != 0) {
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    auVar64 = vrcp14ps_avx512vl(auVar78);
                                    auVar147._8_4_ = 0x3f800000;
                                    auVar147._0_8_ = 0x3f8000003f800000;
                                    auVar147._12_4_ = 0x3f800000;
                                    auVar68 = vfnmadd213ps_fma(auVar78,auVar64,auVar147);
                                    auVar67 = vfmadd132ps_fma(auVar68,auVar64,auVar64);
                                    auVar117._0_4_ = auVar67._0_4_ * auVar65._0_4_;
                                    auVar117._4_4_ = auVar67._4_4_ * auVar65._4_4_;
                                    auVar117._8_4_ = auVar67._8_4_ * auVar65._8_4_;
                                    auVar117._12_4_ = auVar67._12_4_ * auVar65._12_4_;
                                    auVar68 = vminps_avx(auVar117,auVar147);
                                    auVar125._0_4_ = auVar67._0_4_ * auVar124._0_4_;
                                    auVar125._4_4_ = auVar67._4_4_ * auVar124._4_4_;
                                    auVar125._8_4_ = auVar67._8_4_ * auVar124._8_4_;
                                    auVar125._12_4_ = auVar67._12_4_ * auVar124._12_4_;
                                    auVar64 = vminps_avx(auVar125,auVar147);
                                    vsubps_avx(auVar147,auVar68);
                                    vsubps_avx(auVar147,auVar64);
                                    vpbroadcastd_avx512vl();
                                    auVar68 = vpbroadcastd_avx512vl();
                                    auVar149 = ZEXT1664(auVar68);
                                    p0.field_0.field_0.x.field_0 =
                                         (vfloat_impl<4>)(vfloat_impl<4>)vVar88.field_0;
                                    p0.field_0.field_0.y.field_0 =
                                         (vfloat_impl<4>)(vfloat_impl<4>)vVar89.field_0;
                                    p0.field_0._32_16_ = auVar66;
                                    vpcmpeqd_avx2(ZEXT1632((undefined1  [16])vVar88.field_0),
                                                  ZEXT1632((undefined1  [16])vVar88.field_0));
                                    local_1938 = auVar42._0_4_;
                                    iStack_1934 = auVar42._4_4_;
                                    iStack_1930 = auVar42._8_4_;
                                    auVar64 = vmulps_avx512vl(auVar67,auVar132);
                                    bVar59 = (bool)(bVar48 >> 1 & 1);
                                    bVar7 = (bool)(bVar48 >> 2 & 1);
                                    *(uint *)(ray + 0x80) =
                                         (uint)(bVar48 & 1) * auVar64._0_4_ |
                                         (uint)!(bool)(bVar48 & 1) * local_1938;
                                    *(uint *)(ray + 0x84) =
                                         (uint)bVar59 * auVar64._4_4_ | (uint)!bVar59 * iStack_1934;
                                    *(uint *)(ray + 0x88) =
                                         (uint)bVar7 * auVar64._8_4_ | (uint)!bVar7 * iStack_1930;
                                    *(uint *)(ray + 0x8c) =
                                         (uint)(bVar48 >> 3) * auVar64._12_4_ |
                                         (uint)!(bool)(bVar48 >> 3) * (int)fVar95;
                                    itime.field_0 =
                                         (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                         vpmovm2d_avx512vl(uVar62);
                                    p1.field_0._0_8_ = &itime;
                                    p1.field_0._8_8_ = pGVar4->userPtr;
                                    p1.field_0._16_4_ = SUB84(context->user,0);
                                    p1.field_0._20_4_ = (undefined4)((ulong)context->user >> 0x20);
                                    p1.field_0._32_4_ = SUB84(&p0,0);
                                    p1.field_0._36_4_ = (undefined4)((ulong)&p0 >> 0x20);
                                    p1.field_0._40_4_ = 4;
                                    p1.field_0._32_8_ = &p0;
                                    p1.field_0._24_8_ = ray;
                                    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                      auVar149 = ZEXT1664(auVar68);
                                      auVar154 = ZEXT1664(auVar151);
                                      in_ZMM14 = ZEXT1664(auVar93);
                                      in_ZMM15 = ZEXT1664(auVar90);
                                      (*pGVar4->occlusionFilterN)
                                                ((RTCFilterFunctionNArguments *)&p1);
                                    }
                                    uVar46 = vptestmd_avx512vl((undefined1  [16])itime.field_0,
                                                               (undefined1  [16])itime.field_0);
                                    if ((uVar46 & 0xf) == 0) {
                                      uVar62 = 0;
                                    }
                                    else {
                                      p_Var6 = context->args->filter;
                                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                         (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                        auVar149 = ZEXT1664(auVar149._0_16_);
                                        auVar154 = ZEXT1664(auVar154._0_16_);
                                        in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                        in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                                        (*p_Var6)((RTCFilterFunctionNArguments *)&p1);
                                      }
                                      uVar62 = vptestmd_avx512vl((undefined1  [16])itime.field_0,
                                                                 (undefined1  [16])itime.field_0);
                                      uVar62 = uVar62 & 0xf;
                                      auVar68 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                      bVar59 = (bool)((byte)uVar62 & 1);
                                      bVar7 = (bool)((byte)(uVar62 >> 1) & 1);
                                      bVar8 = (bool)((byte)(uVar62 >> 2) & 1);
                                      bVar9 = SUB81(uVar62 >> 3,0);
                                      *(uint *)(p1.field_0._24_8_ + 0x80) =
                                           (uint)bVar59 * auVar68._0_4_ |
                                           (uint)!bVar59 * *(int *)(p1.field_0._24_8_ + 0x80);
                                      *(uint *)(p1.field_0._24_8_ + 0x84) =
                                           (uint)bVar7 * auVar68._4_4_ |
                                           (uint)!bVar7 * *(int *)(p1.field_0._24_8_ + 0x84);
                                      *(uint *)(p1.field_0._24_8_ + 0x88) =
                                           (uint)bVar8 * auVar68._8_4_ |
                                           (uint)!bVar8 * *(int *)(p1.field_0._24_8_ + 0x88);
                                      *(uint *)(p1.field_0._24_8_ + 0x8c) =
                                           (uint)bVar9 * auVar68._12_4_ |
                                           (uint)!bVar9 * *(int *)(p1.field_0._24_8_ + 0x8c);
                                    }
                                    bVar59 = (bool)((byte)uVar62 & 1);
                                    auVar94._0_4_ =
                                         (uint)bVar59 * *(int *)pRVar1 | (uint)!bVar59 * local_1938;
                                    bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
                                    auVar94._4_4_ =
                                         (uint)bVar59 * *(int *)(ray + 0x84) |
                                         (uint)!bVar59 * iStack_1934;
                                    bVar59 = (bool)((byte)(uVar62 >> 2) & 1);
                                    auVar94._8_4_ =
                                         (uint)bVar59 * *(int *)(ray + 0x88) |
                                         (uint)!bVar59 * iStack_1930;
                                    bVar59 = SUB81(uVar62 >> 3,0);
                                    auVar94._12_4_ =
                                         (uint)bVar59 * *(int *)(ray + 0x8c) |
                                         (uint)!bVar59 * (int)fVar95;
                                    *(undefined1 (*) [16])pRVar1 = auVar94;
                                  }
                                  uVar46 = (ulong)(((byte)uVar62 ^ 0xf) & bVar52);
                                  auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar168 = ZEXT1664(auVar68);
                                  auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar169 = ZEXT1664(auVar68);
                                  auVar68 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                  auVar170 = ZEXT1664(auVar68);
                                  auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                  auVar171 = ZEXT1664(auVar68);
                                  auVar63 = vxorps_avx512vl(auVar63,auVar63);
                                  auVar172 = ZEXT1664(auVar63);
                                  auVar63 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar173 = ZEXT1664(auVar63);
                                  goto LAB_006a7774;
                                }
                              }
                            }
                            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar168 = ZEXT1664(auVar68);
                            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar169 = ZEXT1664(auVar68);
                            auVar68 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                            auVar170 = ZEXT1664(auVar68);
                            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                            auVar171 = ZEXT1664(auVar68);
                            auVar63 = vxorps_avx512vl(auVar63,auVar63);
                            auVar172 = ZEXT1664(auVar63);
                            auVar63 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar173 = ZEXT1664(auVar63);
                          }
                        }
                      }
LAB_006a7774:
                      bVar52 = (byte)uVar46;
                      if ((bVar52 == 0) || (bVar59 = 2 < uVar50, uVar50 = uVar50 + 1, bVar59))
                      break;
                    }
                    bVar43 = bVar43 & bVar52;
                    uVar45 = (ulong)bVar43;
                  } while ((bVar43 != 0) && (uVar47 = uVar47 + 1, uVar47 < uVar61 - 8));
                  bVar43 = bVar43 ^ 0xf;
                }
                auVar63 = auVar170._0_16_;
                bVar43 = (byte)local_19cc | bVar43;
                local_19cc = (uint)bVar43;
                if (bVar43 == 0xf) {
                  local_19cc._0_1_ = 0xf;
                  goto LAB_006a83ef;
                }
                auVar63 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar59 = (bool)(bVar43 >> 1 & 1);
                bVar7 = (bool)(bVar43 >> 2 & 1);
                bVar8 = (bool)(bVar43 >> 3 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar59 * auVar63._4_4_ | (uint)!bVar59 * tray.tfar.field_0.i[1];
                tray.tfar.field_0.i[0] =
                     (uint)(bVar43 & 1) * auVar63._0_4_ |
                     (uint)!(bool)(bVar43 & 1) * tray.tfar.field_0.i[0];
                tray.tfar.field_0.i[2] =
                     (uint)bVar7 * auVar63._8_4_ | (uint)!bVar7 * tray.tfar.field_0.i[2];
                tray.tfar.field_0.i[3] =
                     (uint)bVar8 * auVar63._12_4_ | (uint)!bVar8 * tray.tfar.field_0.i[3];
              }
              goto LAB_006a716c;
            }
            uVar11 = vcmpps_avx512vl(auVar105._0_16_,(undefined1  [16])tray.tfar.field_0,9);
            uVar61 = root.ptr & 0xfffffffffffffff0;
            lVar49 = -0x10;
            root.ptr = 8;
            auVar68 = auVar171._0_16_;
            do {
              sVar3 = *(size_t *)(uVar61 + 0x20 + lVar49 * 2);
              if (sVar3 == 8) {
                auVar105 = ZEXT1664(auVar68);
                break;
              }
              uVar57 = *(undefined4 *)(uVar61 + 0x90 + lVar49);
              auVar76._4_4_ = uVar57;
              auVar76._0_4_ = uVar57;
              auVar76._8_4_ = uVar57;
              auVar76._12_4_ = uVar57;
              auVar64 = *(undefined1 (*) [16])(ray + 0x70);
              uVar57 = *(undefined4 *)(uVar61 + 0x30 + lVar49);
              auVar67._4_4_ = uVar57;
              auVar67._0_4_ = uVar57;
              auVar67._8_4_ = uVar57;
              auVar67._12_4_ = uVar57;
              auVar65 = vfmadd213ps_avx512vl(auVar76,auVar64,auVar67);
              uVar57 = *(undefined4 *)(uVar61 + 0xb0 + lVar49);
              auVar91._4_4_ = uVar57;
              auVar91._0_4_ = uVar57;
              auVar91._8_4_ = uVar57;
              auVar91._12_4_ = uVar57;
              uVar57 = *(undefined4 *)(uVar61 + 0x50 + lVar49);
              auVar78._4_4_ = uVar57;
              auVar78._0_4_ = uVar57;
              auVar78._8_4_ = uVar57;
              auVar78._12_4_ = uVar57;
              auVar66 = vfmadd213ps_avx512vl(auVar91,auVar64,auVar78);
              uVar57 = *(undefined4 *)(uVar61 + 0xd0 + lVar49);
              auVar92._4_4_ = uVar57;
              auVar92._0_4_ = uVar57;
              auVar92._8_4_ = uVar57;
              auVar92._12_4_ = uVar57;
              uVar57 = *(undefined4 *)(uVar61 + 0x70 + lVar49);
              auVar69._4_4_ = uVar57;
              auVar69._0_4_ = uVar57;
              auVar69._8_4_ = uVar57;
              auVar69._12_4_ = uVar57;
              auVar69 = vfmadd213ps_avx512vl(auVar92,auVar64,auVar69);
              uVar57 = *(undefined4 *)(uVar61 + 0xa0 + lVar49);
              auVar93._4_4_ = uVar57;
              auVar93._0_4_ = uVar57;
              auVar93._8_4_ = uVar57;
              auVar93._12_4_ = uVar57;
              uVar57 = *(undefined4 *)(uVar61 + 0x40 + lVar49);
              auVar70._4_4_ = uVar57;
              auVar70._0_4_ = uVar57;
              auVar70._8_4_ = uVar57;
              auVar70._12_4_ = uVar57;
              auVar70 = vfmadd213ps_avx512vl(auVar93,auVar64,auVar70);
              uVar57 = *(undefined4 *)(uVar61 + 0xc0 + lVar49);
              auVar82._4_4_ = uVar57;
              auVar82._0_4_ = uVar57;
              auVar82._8_4_ = uVar57;
              auVar82._12_4_ = uVar57;
              uVar57 = *(undefined4 *)(uVar61 + 0x60 + lVar49);
              auVar71._4_4_ = uVar57;
              auVar71._0_4_ = uVar57;
              auVar71._8_4_ = uVar57;
              auVar71._12_4_ = uVar57;
              auVar71 = vfmadd213ps_avx512vl(auVar82,auVar64,auVar71);
              uVar57 = *(undefined4 *)(uVar61 + 0xe0 + lVar49);
              auVar83._4_4_ = uVar57;
              auVar83._0_4_ = uVar57;
              auVar83._8_4_ = uVar57;
              auVar83._12_4_ = uVar57;
              uVar57 = *(undefined4 *)(uVar61 + 0x80 + lVar49);
              auVar72._4_4_ = uVar57;
              auVar72._0_4_ = uVar57;
              auVar72._8_4_ = uVar57;
              auVar72._12_4_ = uVar57;
              auVar72 = vfmadd213ps_avx512vl(auVar83,auVar64,auVar72);
              auVar90._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar90._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar90._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar90._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar77._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar77._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar77._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar77._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar67 = vfmsub213ps_fma(auVar65,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar90);
              auVar78 = vfmsub213ps_fma(auVar66,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar77);
              auVar69 = vfmsub213ps_fma(auVar69,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,
                                        (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0);
              auVar70 = vfmsub213ps_fma(auVar70,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar90);
              auVar71 = vfmsub213ps_fma(auVar71,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar77);
              auVar72 = vfmsub213ps_fma(auVar72,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,
                                        (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0);
              auVar149 = ZEXT1664(auVar72);
              auVar65 = vpminsd_avx(auVar67,auVar70);
              auVar66 = vpminsd_avx(auVar78,auVar71);
              auVar65 = vpmaxsd_avx(auVar65,auVar66);
              auVar66 = vpminsd_avx(auVar69,auVar72);
              auVar154 = ZEXT1664(auVar66);
              auVar65 = vpmaxsd_avx(auVar65,auVar66);
              auVar66 = vpmaxsd_avx(auVar67,auVar70);
              auVar67 = vpmaxsd_avx(auVar78,auVar71);
              auVar67 = vpminsd_avx(auVar66,auVar67);
              auVar66 = vpmaxsd_avx(auVar69,auVar72);
              auVar67 = vpminsd_avx(auVar67,auVar66);
              auVar66 = vpmaxsd_avx(auVar65,(undefined1  [16])tray.tnear.field_0);
              auVar67 = vpminsd_avx(auVar67,(undefined1  [16])tray.tfar.field_0);
              uVar12 = vcmpps_avx512vl(auVar66,auVar67,2);
              bVar43 = (byte)uVar12;
              if ((uVar160 & 7) == 6) {
                uVar57 = *(undefined4 *)(uVar61 + 0x100 + lVar49);
                auVar84._4_4_ = uVar57;
                auVar84._0_4_ = uVar57;
                auVar84._8_4_ = uVar57;
                auVar84._12_4_ = uVar57;
                uVar12 = vcmpps_avx512vl(auVar64,auVar84,1);
                uVar57 = *(undefined4 *)(uVar61 + 0xf0 + lVar49);
                auVar85._4_4_ = uVar57;
                auVar85._0_4_ = uVar57;
                auVar85._8_4_ = uVar57;
                auVar85._12_4_ = uVar57;
                uVar13 = vcmpps_avx512vl(auVar64,auVar85,0xd);
                bVar43 = (byte)uVar12 & (byte)uVar13 & bVar43;
              }
              bVar43 = bVar43 & (byte)uVar11;
              if (bVar43 == 0) {
                auVar105 = ZEXT1664(auVar68);
                sVar3 = root.ptr;
              }
              else {
                auVar65 = vblendmps_avx512vl(auVar171._0_16_,auVar65);
                bVar59 = (bool)(bVar43 >> 1 & 1);
                bVar7 = (bool)(bVar43 >> 2 & 1);
                bVar8 = (bool)(bVar43 >> 3 & 1);
                auVar105 = ZEXT1664(CONCAT412((uint)bVar8 * auVar65._12_4_ |
                                              (uint)!bVar8 * auVar64._12_4_,
                                              CONCAT48((uint)bVar7 * auVar65._8_4_ |
                                                       (uint)!bVar7 * auVar64._8_4_,
                                                       CONCAT44((uint)bVar59 * auVar65._4_4_ |
                                                                (uint)!bVar59 * auVar64._4_4_,
                                                                (uint)(bVar43 & 1) * auVar65._0_4_ |
                                                                (uint)!(bool)(bVar43 & 1) *
                                                                auVar64._0_4_))));
                if (root.ptr != 8) {
                  pNVar51->ptr = root.ptr;
                  pNVar51 = pNVar51 + 1;
                  *(undefined1 (*) [16])paVar58->v = auVar68;
                  paVar58 = paVar58 + 1;
                }
              }
              root.ptr = sVar3;
              auVar68 = auVar105._0_16_;
              lVar49 = lVar49 + 4;
            } while (lVar49 != 0);
            if (root.ptr == 8) goto LAB_006a73a2;
            uVar11 = vcmpps_avx512vl((undefined1  [16])auVar105._0_16_,
                                     (undefined1  [16])tray.tfar.field_0,9);
          } while ((byte)uVar56 < (byte)POPCOUNT((int)uVar11));
          pNVar51->ptr = root.ptr;
          pNVar51 = pNVar51 + 1;
          *paVar58 = auVar105._0_16_;
          paVar58 = paVar58 + 1;
LAB_006a73a2:
          iVar44 = 4;
        }
        else {
          do {
            sVar3 = 0;
            for (uVar45 = uVar61; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
              sVar3 = sVar3 + 1;
            }
            auVar149 = ZEXT1664(auVar149._0_16_);
            auVar154 = ZEXT1664(auVar154._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            bVar59 = occluded1(This,bvh,root,sVar3,&pre,ray,&tray,context);
            bVar43 = (byte)(1 << ((uint)sVar3 & 0x1f));
            if (!bVar59) {
              bVar43 = 0;
            }
            bVar43 = (byte)local_19cc | bVar43;
            local_19cc = (uint)bVar43;
            uVar61 = uVar61 - 1 & uVar61;
          } while (uVar61 != 0);
          iVar44 = 3;
          if (bVar43 != 0xf) {
            auVar63 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)(bVar43 & 1) * auVar63._0_4_ |
                 (uint)!(bool)(bVar43 & 1) * tray.tfar.field_0.i[0];
            bVar59 = (bool)(bVar43 >> 1 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar59 * auVar63._4_4_ | (uint)!bVar59 * tray.tfar.field_0.i[1];
            bVar59 = (bool)(bVar43 >> 2 & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar59 * auVar63._8_4_ | (uint)!bVar59 * tray.tfar.field_0.i[2];
            bVar59 = (bool)(bVar43 >> 3 & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar59 * auVar63._12_4_ | (uint)!bVar59 * tray.tfar.field_0.i[3];
            iVar44 = 2;
          }
          auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar168 = ZEXT1664(auVar63);
          auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar169 = ZEXT1664(auVar63);
          auVar63 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar170 = ZEXT1664(auVar63);
          auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar171 = ZEXT1664(auVar63);
          auVar63 = vxorps_avx512vl(auVar172._0_16_,auVar172._0_16_);
          auVar172 = ZEXT1664(auVar63);
          auVar63 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar173 = ZEXT1664(auVar63);
          if (uVar56 < (uint)POPCOUNT(uVar57)) goto LAB_006a71b4;
        }
        auVar63 = auVar170._0_16_;
        if (iVar44 == 3) {
LAB_006a83ef:
          local_19cc._0_1_ = (byte)local_19cc & bVar60;
          bVar59 = (bool)((byte)local_19cc >> 1 & 1);
          bVar7 = (bool)((byte)local_19cc >> 2 & 1);
          *(uint *)pRVar1 =
               (uint)((byte)local_19cc & 1) * auVar63._0_4_ |
               (uint)!(bool)((byte)local_19cc & 1) * *(int *)pRVar1;
          *(uint *)(ray + 0x84) =
               (uint)bVar59 * auVar63._4_4_ | (uint)!bVar59 * *(int *)(ray + 0x84);
          *(uint *)(ray + 0x88) = (uint)bVar7 * auVar63._8_4_ | (uint)!bVar7 * *(int *)(ray + 0x88);
          *(uint *)(ray + 0x8c) =
               (uint)((byte)local_19cc >> 3) * auVar63._12_4_ |
               (uint)!(bool)((byte)local_19cc >> 3) * *(int *)(ray + 0x8c);
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }